

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

ParameterizedTestSuiteInfo<test_libaom::AV1CornerMatch::AV1CornerMatchTest> *
testing::internal::
CheckedDowncastToActualType<testing::internal::ParameterizedTestSuiteInfo<test_libaom::AV1CornerMatch::AV1CornerMatchTest>,testing::internal::ParameterizedTestSuiteInfoBase>
          (ParameterizedTestSuiteInfoBase *base)

{
  bool bVar1;
  ParameterizedTestSuiteInfo<test_libaom::AV1CornerMatch::AV1CornerMatchTest> *pPVar2;
  undefined8 uVar3;
  GTestLog local_c;
  
  if (base != (ParameterizedTestSuiteInfoBase *)0x0) {
    bVar1 = std::type_info::operator==
                      ((type_info *)base->_vptr_ParameterizedTestSuiteInfoBase[-1],
                       (type_info *)
                       &ParameterizedTestSuiteInfo<test_libaom::AV1CornerMatch::AV1CornerMatchTest>
                        ::typeinfo);
    bVar1 = IsTrue(bVar1);
    if (!bVar1) {
      GTestLog::GTestLog(&local_c,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-port.h"
                         ,0x45e);
      std::operator<<((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ");
      GTestLog::~GTestLog(&local_c);
    }
    pPVar2 = (ParameterizedTestSuiteInfo<test_libaom::AV1CornerMatch::AV1CornerMatchTest> *)
             __dynamic_cast(base,&ParameterizedTestSuiteInfoBase::typeinfo,
                            &ParameterizedTestSuiteInfo<test_libaom::AV1CornerMatch::AV1CornerMatchTest>
                             ::typeinfo,0);
    return pPVar2;
  }
  uVar3 = __cxa_bad_typeid();
  GTestLog::~GTestLog(&local_c);
  _Unwind_Resume(uVar3);
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
#endif

#if GTEST_HAS_DOWNCAST_
  return ::down_cast<Derived*>(base);
#elif GTEST_HAS_RTTI
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}